

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlschemas.c
# Opt level: O1

int xmlSchemaCheckSRCRedefineSecond(xmlSchemaParserCtxtPtr pctxt)

{
  xmlSchemaTypeType xVar1;
  xmlSchemaRedefPtr_conflict pxVar2;
  xmlSchemaBasicItemPtr baseItem;
  xmlSchemaBasicItemPtr item;
  uint uVar3;
  xmlSchemaConstructionCtxtPtr pxVar4;
  
  pxVar4 = pctxt->constructor;
  pxVar2 = pxVar4->redefs;
  do {
    if (pxVar2 == (xmlSchemaRedefPtr_conflict)0x0) {
      return (int)pxVar4;
    }
    baseItem = pxVar2->target;
    if (baseItem != (xmlSchemaBasicItemPtr)0x0) {
      item = pxVar2->item;
      xVar1 = item->type;
      pxVar4 = (xmlSchemaConstructionCtxtPtr)(ulong)xVar1;
      if (xVar1 - XML_SCHEMA_TYPE_SIMPLE < 2) {
        *(undefined8 *)(baseItem + 1) = 0;
      }
      else if (xVar1 == XML_SCHEMA_TYPE_ATTRIBUTEGROUP) {
        uVar3 = xmlSchemaCheckDerivationOKRestriction2to4
                          (pctxt,1,item,baseItem,*(xmlSchemaItemListPtr *)(item + 7),
                           *(xmlSchemaItemListPtr *)(baseItem + 7),
                           *(xmlSchemaWildcardPtr *)(item + 5),
                           *(xmlSchemaWildcardPtr *)(baseItem + 5));
        pxVar4 = (xmlSchemaConstructionCtxtPtr)(ulong)uVar3;
        if (uVar3 == 0xffffffff) {
          return -1;
        }
      }
    }
    pxVar2 = pxVar2->next;
  } while( true );
}

Assistant:

static int
xmlSchemaCheckSRCRedefineSecond(xmlSchemaParserCtxtPtr pctxt)
{
    int err = 0;
    xmlSchemaRedefPtr redef = WXS_CONSTRUCTOR(pctxt)->redefs;
    xmlSchemaBasicItemPtr item;

    if (redef == NULL)
	return(0);

    do {
	if (redef->target == NULL) {
	    redef = redef->next;
	    continue;
	}
	item = redef->item;

	switch (item->type) {
	    case XML_SCHEMA_TYPE_SIMPLE:
	    case XML_SCHEMA_TYPE_COMPLEX:
		/*
		* Since the spec wants the {name} of the redefined
		* type to be 'absent', we'll NULL it.
		*/
		(WXS_TYPE_CAST redef->target)->name = NULL;

		/*
		* TODO: Seems like there's nothing more to do. The normal
		* inheritance mechanism is used. But not 100% sure.
		*/
		break;
	    case XML_SCHEMA_TYPE_GROUP:
		/*
		* URGENT TODO:
		* SPEC src-redefine:
		* (6.2.2) "The {model group} of the model group definition
		* which corresponds to it per XML Representation of Model
		* Group Definition Schema Components ($3.7.2) must be a
		* `valid restriction` of the {model group} of that model
		* group definition in I, as defined in Particle Valid
		* (Restriction) ($3.9.6)."
		*/
		break;
	    case XML_SCHEMA_TYPE_ATTRIBUTEGROUP:
		/*
		* SPEC src-redefine:
		* (7.2.2) "The {attribute uses} and {attribute wildcard} of
		* the attribute group definition which corresponds to it
		* per XML Representation of Attribute Group Definition Schema
		* Components ($3.6.2) must be `valid restrictions` of the
		* {attribute uses} and {attribute wildcard} of that attribute
		* group definition in I, as defined in clause 2, clause 3 and
		* clause 4 of Derivation Valid (Restriction, Complex)
		* ($3.4.6) (where references to the base type definition are
		* understood as references to the attribute group definition
		* in I)."
		*/
		err = xmlSchemaCheckDerivationOKRestriction2to4(pctxt,
		    XML_SCHEMA_ACTION_REDEFINE,
		    item, redef->target,
		    (WXS_ATTR_GROUP_CAST item)->attrUses,
		    (WXS_ATTR_GROUP_CAST redef->target)->attrUses,
		    (WXS_ATTR_GROUP_CAST item)->attributeWildcard,
		    (WXS_ATTR_GROUP_CAST redef->target)->attributeWildcard);
		if (err == -1)
		    return(-1);
		break;
	    default:
		break;
	}
	redef = redef->next;
    } while (redef != NULL);
    return(0);
}